

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O0

uint64_t dsOffset(void *address)

{
  dsCrate *crate_00;
  dsCrate *crate;
  void *address_local;
  
  crate_00 = getActiveCrate();
  if (crate_00 == (dsCrate *)0x0) {
    dsRunLogCallback("%s(): Can\'t get active crate.\n","dsOffset");
    address_local = (void *)0xffffffffffffffff;
  }
  else {
    address_local = (void *)objectOffset(crate_00,address);
  }
  return (uint64_t)address_local;
}

Assistant:

uint64_t
dsOffset(void *address)
{
	dsCrate *crate;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return UINT64_MAX;
	}

	return objectOffset(crate, address);
}